

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

char * read_filename(DirHandle *dir)

{
  dirent *pdVar1;
  char *pcVar2;
  
  do {
    pdVar1 = readdir((DIR *)dir->dir);
    if (pdVar1 == (dirent *)0x0) {
      return (char *)0x0;
    }
  } while ((pdVar1->d_name[0] == '.') &&
          ((pdVar1->d_name[1] == '\0' || ((pdVar1->d_name[1] == '.' && (pdVar1->d_name[2] == '\0')))
           )));
  pcVar2 = dupstr(pdVar1->d_name);
  return pcVar2;
}

Assistant:

char *read_filename(DirHandle *dir)
{
    struct dirent *de;

    do {
        de = readdir(dir->dir);
        if (de == NULL)
            return NULL;
    } while ((de->d_name[0] == '.' &&
              (de->d_name[1] == '\0' ||
               (de->d_name[1] == '.' && de->d_name[2] == '\0'))));

    return dupstr(de->d_name);
}